

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::test_case_exception
          (ConsoleReporter *this,TestCaseException *e)

{
  TestCaseData *pTVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  TestCaseData *pTVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  
  if (this->tc->m_no_output != false) {
    return;
  }
  logTestStart(this);
  pTVar1 = this->tc;
  pTVar6 = pTVar1;
  if ((pTVar1->m_file).field_0.buf[0x17] < '\0') {
    pTVar6 = (TestCaseData *)(pTVar1->m_file).field_0.data.ptr;
  }
  pcVar3 = " ";
  (*(this->super_IReporter)._vptr_IReporter[0xe])(this,pTVar6,(ulong)pTVar1->m_line);
  successOrFailColoredStringToStream
            ((ConsoleReporter *)this->s,false,(uint)e->is_crash * 2 + is_check,pcVar3);
  poVar2 = this->s;
  Color::operator<<(poVar2,Red);
  pcVar3 = "test case THREW exception: ";
  if (e->is_crash != false) {
    pcVar3 = "test case CRASHED: ";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,pcVar3,(ulong)(e->is_crash ^ 1) * 8 + 0x13);
  Color::operator<<(poVar2,Cyan);
  doctest::operator<<(poVar2,&e->error_string);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  uVar7 = (int)(*(long *)(detail::g_cs + 0x1108) - *(long *)(detail::g_cs + 0x1100) >> 3) *
          -0x55555555;
  if (uVar7 != 0) {
    lVar9 = *(long *)(detail::g_cs + 0x1100);
    if (uVar7 == 0) {
      lVar9 = 0;
    }
    poVar2 = this->s;
    Color::operator<<(poVar2,None);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  logged: ",10);
    if (0 < (int)uVar7) {
      uVar8 = (ulong)(uVar7 & 0x7fffffff) + 1;
      lVar5 = 0;
      do {
        pcVar3 = "          ";
        if (lVar5 == 0) {
          pcVar3 = "";
        }
        poVar2 = this->s;
        lVar4 = 10;
        if (lVar5 == 0) {
          lVar4 = 0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,lVar4);
        doctest::operator<<(poVar2,(String *)
                                   (lVar9 + (ulong)(uVar7 & 0x7fffffff) * 0x18 + -0x18 + lVar5));
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        uVar8 = uVar8 - 1;
        lVar5 = lVar5 + -0x18;
      } while (1 < uVar8);
    }
  }
  poVar2 = this->s;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  Color::operator<<(poVar2,None);
  return;
}

Assistant:

void test_case_exception(const TestCaseException& e) override {
            if(tc->m_no_output)
                return;

            logTestStart();

            file_line_to_stream(tc->m_file.c_str(), tc->m_line, " ");
            successOrFailColoredStringToStream(false, e.is_crash ? assertType::is_require :
                                                                   assertType::is_check);
            s << Color::Red << (e.is_crash ? "test case CRASHED: " : "test case THREW exception: ")
              << Color::Cyan << e.error_string << "\n";

            int num_stringified_contexts = get_num_stringified_contexts();
            if(num_stringified_contexts) {
                auto stringified_contexts = get_stringified_contexts();
                s << Color::None << "  logged: ";
                for(int i = num_stringified_contexts; i > 0; --i) {
                    s << (i == num_stringified_contexts ? "" : "          ")
                      << stringified_contexts[i - 1] << "\n";
                }
            }
            s << "\n" << Color::None;
        }